

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_iret_real_x86_64(CPUX86State *env,int shift)

{
  target_ulong tVar1;
  int iVar2;
  uint update_mask;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t eflags;
  ulong addr;
  uintptr_t unaff_retaddr;
  
  tVar1 = env->segs[2].base;
  addr = (env->regs[4] & 0xffff) + tVar1;
  iVar2 = (int)env->regs[4];
  if (shift == 1) {
    iVar3 = cpu_mmu_index_kernel(env);
    uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,addr & 0xffffffff,iVar3,unaff_retaddr);
    iVar3 = cpu_mmu_index_kernel(env);
    uVar5 = cpu_ldl_mmuidx_ra_x86_64
                      (env,(ulong)((iVar2 + 4U & 0xffff) + (int)tVar1),iVar3,unaff_retaddr);
    uVar5 = uVar5 & 0xffff;
    iVar3 = cpu_mmu_index_kernel(env);
    eflags = cpu_ldl_mmuidx_ra_x86_64
                       (env,(ulong)((iVar2 + 8U & 0xffff) + (int)tVar1),iVar3,unaff_retaddr);
    iVar3 = 0xc;
  }
  else {
    iVar3 = cpu_mmu_index_kernel(env);
    uVar4 = cpu_lduw_mmuidx_ra_x86_64(env,addr,iVar3,unaff_retaddr);
    iVar3 = cpu_mmu_index_kernel(env);
    uVar5 = cpu_lduw_mmuidx_ra_x86_64(env,(iVar2 + 2U & 0xffff) + tVar1,iVar3,unaff_retaddr);
    iVar3 = cpu_mmu_index_kernel(env);
    eflags = cpu_lduw_mmuidx_ra_x86_64(env,(iVar2 + 4U & 0xffff) + tVar1,iVar3,unaff_retaddr);
    iVar3 = 6;
  }
  env->regs[4] = (ulong)(iVar2 + iVar3 & 0xffffU | (uint)*(ushort *)((long)env->regs + 0x22) << 0x10
                        );
  env->segs[1].selector = uVar5;
  env->segs[1].base = (ulong)(uVar5 << 4);
  env->eip = (ulong)uVar4;
  uVar4 = 0x254300;
  if (((uint)env->eflags >> 0x11 & 1) == 0) {
    uVar4 = 0x257300;
  }
  update_mask = uVar4 & 0xffff;
  if (shift != 0) {
    update_mask = uVar4;
  }
  cpu_load_eflags(env,eflags,update_mask);
  *(byte *)&env->hflags2 = (byte)env->hflags2 & 0xfb;
  return;
}

Assistant:

void helper_iret_real(CPUX86State *env, int shift)
{
    uint32_t sp, new_cs, new_eip, new_eflags, sp_mask;
    target_ulong ssp;
    int eflags_mask;

    sp_mask = 0xffff; /* XXXX: use SS segment size? */
    sp = env->regs[R_ESP];
    ssp = env->segs[R_SS].base;
    if (shift == 1) {
        /* 32 bits */
        POPL_RA(ssp, sp, sp_mask, new_eip, GETPC());
        POPL_RA(ssp, sp, sp_mask, new_cs, GETPC());
        new_cs &= 0xffff;
        POPL_RA(ssp, sp, sp_mask, new_eflags, GETPC());
    } else {
        /* 16 bits */
        POPW_RA(ssp, sp, sp_mask, new_eip, GETPC());
        POPW_RA(ssp, sp, sp_mask, new_cs, GETPC());
        POPW_RA(ssp, sp, sp_mask, new_eflags, GETPC());
    }
    env->regs[R_ESP] = (env->regs[R_ESP] & ~sp_mask) | (sp & sp_mask);
    env->segs[R_CS].selector = new_cs;
    env->segs[R_CS].base = (new_cs << 4);
    env->eip = new_eip;
    if (env->eflags & VM_MASK) {
        eflags_mask = TF_MASK | AC_MASK | ID_MASK | IF_MASK | RF_MASK |
            NT_MASK;
    } else {
        eflags_mask = TF_MASK | AC_MASK | ID_MASK | IF_MASK | IOPL_MASK |
            RF_MASK | NT_MASK;
    }
    if (shift == 0) {
        eflags_mask &= 0xffff;
    }
    cpu_load_eflags(env, new_eflags, eflags_mask);
    env->hflags2 &= ~HF2_NMI_MASK;
}